

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O2

size_t __thiscall
libchars::commands::render(commands *this,size_t buf_idx,size_t limit,string *sequence)

{
  size_t *psVar1;
  pointer pcVar2;
  string *psVar3;
  size_t *psVar4;
  size_t sVar5;
  long lVar6;
  ulong uVar7;
  string local_58 [32];
  string *local_38;
  
  local_38 = sequence;
  parse(this);
  pcVar2 = (this->characters).
           super__Vector_base<libchars::command_char,_std::allocator<libchars::command_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar6 = 0;
  sVar5 = buf_idx;
  uVar7 = 0;
  for (psVar4 = &pcVar2[buf_idx].render_length;
      ((uVar7 < limit && (sVar5 < (this->super_edit_object).buflen)) &&
      (psVar1 = psVar4 + -3, *psVar1 + uVar7 <= limit)); psVar4 = psVar4 + 7) {
    sVar5 = sVar5 + 1;
    lVar6 = lVar6 + *psVar4;
    uVar7 = *psVar1 + uVar7;
  }
  if (lVar6 == 0) {
    local_38->_M_string_length = 0;
    *(local_38->_M_dataplus)._M_p = '\0';
  }
  else {
    if ((pcVar2[buf_idx].T != (token *)0x0) && ((pcVar2[buf_idx].T)->offset < buf_idx)) {
      color_str(this,pcVar2[buf_idx].color);
      std::__cxx11::string::append((char *)local_38);
    }
    std::__cxx11::string::substr((ulong)local_58,(ulong)&this->rendered_str);
    psVar3 = local_38;
    std::__cxx11::string::operator=((string *)local_38,local_58);
    std::__cxx11::string::~string(local_58);
    std::__cxx11::string::append((char *)psVar3);
  }
  return uVar7;
}

Assistant:

size_t commands::render(size_t buf_idx, size_t limit, std::string &sequence)
    {
        parse();

        size_t idx = buf_idx, displayed = 0, r_offset = 0, r_length = 0;
        while (idx < length() && displayed < limit) {
            command_char &C = characters[idx++];
            if ((displayed + C.display_length) > limit)
                break;
            if (r_length == 0) {
                r_offset = C.render_offset;
                r_length = C.render_length;
            }
            else {
                r_length += C.render_length;
            }
            displayed += C.display_length;
        }

        if (r_length > 0) {
            // add token color if render has to start in the middle of a token
            command_char &C = characters[buf_idx];
            if (C.T != NULL && buf_idx > C.T->offset)
                sequence.append(color_str(C.color));
            sequence = rendered_str.substr(r_offset, r_length);
            sequence.append(color_str(COLOR_NORMAL)); // just in case the rest of the terminal gets messed up
        }
        else {
            sequence.clear();
        }

        return displayed;
    }